

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
DoInitProperty_NoFastPath<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout,Var instance)

{
  InlineCacheIndex inlineCacheIndex;
  PropertyId propertyId;
  FunctionBody *functionBody;
  InlineCache *inlineCache;
  RecyclableObject *object;
  Var newValue;
  Var instance_local;
  OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  functionBody = GetFunctionBody(this);
  inlineCache = GetInlineCache(this,playout->inlineCacheIndex);
  inlineCacheIndex = playout->inlineCacheIndex;
  object = VarTo<Js::RecyclableObject>(instance);
  propertyId = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  newValue = GetReg<unsigned_short>(this,playout->Value);
  Js::JavascriptOperators::PatchInitValue<false,Js::InlineCache>
            (functionBody,inlineCache,inlineCacheIndex,object,propertyId,newValue);
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::DoInitProperty_NoFastPath(unaligned T* playout, Var instance)
    {
        JavascriptOperators::PatchInitValue<false>(
            GetFunctionBody(),
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            VarTo<RecyclableObject>(instance),
            GetPropertyIdFromCacheId(playout->inlineCacheIndex),
            GetReg(playout->Value));
    }